

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O3

void __thiscall sago::PlatformFolders::PlatformFolders(PlatformFolders *this)

{
  _Rb_tree_node_base *this_00;
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar6;
  mapped_type *pmVar7;
  long *plVar8;
  istream *piVar9;
  long lVar10;
  undefined8 *puVar11;
  _Base_ptr p_Var12;
  long *plVar13;
  ulong uVar14;
  undefined8 uVar15;
  bool bVar16;
  size_type __dnew;
  string key;
  ifstream infile;
  char *local_2f0;
  long local_2e8;
  char local_2e0;
  undefined7 uStack_2df;
  key_type local_2d0;
  PlatformFolders *local_2b0;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_288;
  _Base_ptr local_280;
  long *local_278 [2];
  long local_268 [2];
  string local_258;
  key_type local_238 [16];
  
  pmVar6 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)operator_new(0x30);
  local_280 = &(pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header;
  (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pmVar6->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = local_280;
  (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = local_280;
  (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->data = (PlatformFoldersData *)pmVar6;
  paVar2 = &local_238[0].field_2;
  local_2f0 = (char *)0x11;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_2f0);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_2f0,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_2f0 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_2f0 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_2f0 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_DOCUMENTS_DIR",0x11);
  local_238[0]._M_string_length = (size_type)local_2f0;
  local_238[0]._M_dataplus._M_p[(long)local_2f0] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x107211);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x445f474458;
  local_238[0].field_2._M_local_buf[5] = 'E';
  local_238[0].field_2._M_local_buf[6] = 'S';
  local_238[0].field_2._M_local_buf[7] = 'K';
  local_238[0].field_2._8_5_ = 0x445f504f54;
  local_238[0].field_2._M_local_buf[0xd] = 'I';
  local_238[0].field_2._M_local_buf[0xe] = 'R';
  local_238[0]._M_string_length = 0xf;
  local_238[0].field_2._M_local_buf[0xf] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x107221);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_2f0 = (char *)0x10;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_2f0);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_2f0,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_2f0 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_2f0 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_2f0 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_DOWNLOAD_DIR",0x10);
  local_238[0]._M_string_length = (size_type)local_2f0;
  local_238[0]._M_dataplus._M_p[(long)local_2f0] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x10722f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x4d5f474458;
  local_238[0].field_2._M_local_buf[5] = 'U';
  local_238[0].field_2._M_local_buf[6] = 'S';
  local_238[0].field_2._M_local_buf[7] = 'I';
  local_238[0].field_2._8_5_ = 0x5249445f43;
  local_238[0]._M_string_length = 0xd;
  local_238[0].field_2._M_local_buf[0xd] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x10723f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_2f0 = (char *)0x10;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_2f0);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_2f0,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_2f0 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_2f0 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_2f0 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_PICTURES_DIR",0x10);
  local_238[0]._M_string_length = (size_type)local_2f0;
  local_238[0]._M_dataplus._M_p[(long)local_2f0] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x10724b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_2f0 = (char *)0x13;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_2f0);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_2f0,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_2f0 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_2f0 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_2f0 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_PUBLICSHARE_DIR",0x13);
  local_238[0]._M_string_length = (size_type)local_2f0;
  local_238[0]._M_dataplus._M_p[(long)local_2f0] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x10725a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_2f0 = (char *)0x11;
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  local_238[0]._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)local_238,(ulong)&local_2f0);
  local_238[0].field_2._M_allocated_capacity._0_5_ = SUB85(local_2f0,0);
  local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)local_2f0 >> 0x28);
  local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)local_2f0 >> 0x30);
  local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)local_2f0 >> 0x38);
  builtin_strncpy(local_238[0]._M_dataplus._M_p,"XDG_TEMPLATES_DIR",0x11);
  local_238[0]._M_string_length = (size_type)local_2f0;
  local_238[0]._M_dataplus._M_p[(long)local_2f0] = '\0';
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x107267);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  local_238[0].field_2._M_allocated_capacity._0_5_ = 0x565f474458;
  local_238[0].field_2._M_local_buf[5] = 'I';
  local_238[0].field_2._M_local_buf[6] = 'D';
  local_238[0].field_2._M_local_buf[7] = 'E';
  local_238[0].field_2._8_5_ = 0x49445f534f;
  local_238[0].field_2._M_local_buf[0xd] = 'R';
  local_238[0]._M_string_length = 0xe;
  local_238[0].field_2._M_local_buf[0xe] = '\0';
  local_238[0]._M_dataplus._M_p = (pointer)paVar2;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](pmVar6,local_238);
  std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x10728a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_238[0]._M_dataplus._M_p,
                    CONCAT17(local_238[0].field_2._M_local_buf[7],
                             CONCAT16(local_238[0].field_2._M_local_buf[6],
                                      CONCAT15(local_238[0].field_2._M_local_buf[5],
                                               (undefined5)
                                               local_238[0].field_2._M_allocated_capacity))) + 1);
  }
  getLinuxFolderDefault_abi_cxx11_(&local_258,"XDG_CONFIG_HOME",".config");
  local_2b0 = this;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_2a8 = &local_298;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_298 = *plVar13;
    lStack_290 = plVar8[3];
  }
  else {
    local_298 = *plVar13;
    local_2a8 = (long *)*plVar8;
  }
  local_2a0 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_288 = pmVar6;
  std::ifstream::ifstream(local_238,(char *)local_2a8,_S_in);
  local_2f0 = &local_2e0;
  local_2e8 = 0;
  local_2e0 = '\0';
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                            (char)local_238);
    piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2f0,cVar4);
    if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
    if ((local_2e8 != 0) && (*local_2f0 != '#')) {
      std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_2f0);
      iVar5 = std::__cxx11::string::compare((char *)&local_2d0);
      bVar16 = true;
      if (iVar5 == 0) {
        lVar10 = std::__cxx11::string::find((char *)&local_2f0,0x107186,0);
        bVar16 = lVar10 == -1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar16) {
        cVar4 = (char)(string *)&local_2f0;
        std::__cxx11::string::find(cVar4,0x3d);
        std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&local_2f0);
        std::__cxx11::string::find(cVar4,0x22);
        std::__cxx11::string::find(cVar4,0x22);
        std::__cxx11::string::substr((ulong)local_278,(ulong)&local_2f0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_288,&local_2d0);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if (local_278[0] != local_268) {
          operator_delete(local_278[0],local_268[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
  }
  std::ifstream::~ifstream(local_238);
  pmVar6 = local_288;
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  p_Var12 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var12 != local_280) {
    do {
      this_00 = p_Var12 + 2;
      iVar5 = std::__cxx11::string::compare((ulong)this_00,0,(char *)0x5);
      if (iVar5 == 0) {
        internal::getHome_abi_cxx11_();
        std::__cxx11::string::substr((ulong)&local_2d0,(ulong)this_00);
        uVar14 = 0xf;
        if (local_2f0 != &local_2e0) {
          uVar14 = CONCAT71(uStack_2df,local_2e0);
        }
        if (uVar14 < local_2d0._M_string_length + local_2e8) {
          uVar15 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            uVar15 = local_2d0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar15 < local_2d0._M_string_length + local_2e8) goto LAB_001055ab;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_2f0);
        }
        else {
LAB_001055ab:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_2f0,(ulong)local_2d0._M_dataplus._M_p);
        }
        local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
        puVar1 = puVar11 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1) {
          uVar15 = *puVar1;
          uVar3 = puVar11[3];
          local_238[0].field_2._M_allocated_capacity._0_5_ = (undefined5)uVar15;
          local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)uVar15 >> 0x28);
          local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)uVar15 >> 0x30);
          local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)uVar15 >> 0x38);
          local_238[0].field_2._8_5_ = (undefined5)uVar3;
          local_238[0].field_2._M_local_buf[0xd] = (undefined1)((ulong)uVar3 >> 0x28);
          local_238[0].field_2._M_local_buf[0xe] = (undefined1)((ulong)uVar3 >> 0x30);
          local_238[0].field_2._M_local_buf[0xf] = (undefined1)((ulong)uVar3 >> 0x38);
        }
        else {
          uVar15 = *puVar1;
          local_238[0].field_2._M_allocated_capacity._0_5_ = (undefined5)uVar15;
          local_238[0].field_2._M_local_buf[5] = (undefined1)((ulong)uVar15 >> 0x28);
          local_238[0].field_2._M_local_buf[6] = (undefined1)((ulong)uVar15 >> 0x30);
          local_238[0].field_2._M_local_buf[7] = (undefined1)((ulong)uVar15 >> 0x38);
          local_238[0]._M_dataplus._M_p = (pointer)*puVar11;
        }
        local_238[0]._M_string_length = puVar11[1];
        *puVar11 = puVar1;
        puVar11[1] = 0;
        *(undefined1 *)puVar1 = 0;
        std::__cxx11::string::operator=((string *)this_00,(string *)local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
          operator_delete(local_238[0]._M_dataplus._M_p,
                          CONCAT17(local_238[0].field_2._M_local_buf[7],
                                   CONCAT16(local_238[0].field_2._M_local_buf[6],
                                            CONCAT15(local_238[0].field_2._M_local_buf[5],
                                                     (undefined5)
                                                     local_238[0].field_2._M_allocated_capacity))) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0,CONCAT71(uStack_2df,local_2e0) + 1);
        }
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while (p_Var12 != local_280);
  }
  return;
}

Assistant:

PlatformFolders::PlatformFolders() {
#if !defined(_WIN32) && !defined(__APPLE__)
	this->data = new PlatformFolders::PlatformFoldersData();
	try {
		PlatformFoldersFillData(data->folders);
	}
	catch (...) {
		delete this->data;
		throw;
	}
#endif
}